

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool unstylable(QWidget *w)

{
  long lVar1;
  byte bVar2;
  WindowType WVar3;
  QWidget *pQVar4;
  QFrame *pQVar5;
  QComboBox *pQVar6;
  QMetaObject *pQVar7;
  QTabBar *pQVar8;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool bVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WVar3 = QWidget::windowType(in_RDI);
  if (WVar3 == Desktop) {
    bVar9 = true;
  }
  else {
    QWidget::styleSheet((QWidget *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    bVar9 = QString::isEmpty((QString *)0x42b969);
    bVar2 = bVar9 ^ 0xff;
    QString::~QString((QString *)0x42b979);
    if ((bVar2 & 1) == 0) {
      pQVar4 = containerWidget((QWidget *)
                               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffce,
                                                       in_stack_ffffffffffffffc8)));
      if (pQVar4 == in_RDI) {
        pQVar5 = qobject_cast<QFrame_const*>((QObject *)0x42b9af);
        if (pQVar5 != (QFrame *)0x0) {
          QWidget::parentWidget((QWidget *)0x42b9bf);
          pQVar6 = qobject_cast<QComboBox_const*>((QObject *)0x42b9c7);
          if (pQVar6 != (QComboBox *)0x0) {
            bVar9 = true;
            goto LAB_0042ba12;
          }
        }
        pQVar7 = (QMetaObject *)(*(code *)**(undefined8 **)in_RDI)();
        if (pQVar7 == &QWidget::staticMetaObject) {
          QWidget::parentWidget((QWidget *)0x42b9f8);
          pQVar8 = qobject_cast<QTabBar_const*>((QObject *)0x42ba00);
          if (pQVar8 != (QTabBar *)0x0) {
            bVar9 = true;
            goto LAB_0042ba12;
          }
        }
        bVar9 = false;
      }
      else {
        bVar9 = true;
      }
    }
    else {
      bVar9 = false;
    }
  }
LAB_0042ba12:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

static bool unstylable(const QWidget *w)
{
    if (w->windowType() == Qt::Desktop)
        return true;

    if (!w->styleSheet().isEmpty())
        return false;

    if (containerWidget(w) != w)
        return true;

#ifndef QT_NO_FRAME
    // detect QComboBoxPrivateContainer
    else if (qobject_cast<const QFrame *>(w)) {
        if (0
#if QT_CONFIG(combobox)
            || qobject_cast<const QComboBox *>(w->parentWidget())
#endif
           )
            return true;
    }
#endif

#if QT_CONFIG(tabbar)
    if (w->metaObject() == &QWidget::staticMetaObject
            && qobject_cast<const QTabBar*>(w->parentWidget()))
        return true; // The moving tab of a QTabBar
#endif

    return false;
}